

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ProgressBar::paintEvent(ProgressBar *this,QPaintEvent *param_1)

{
  Orientation OVar1;
  ProgressBarPrivate *pPVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  QPainter p;
  QRect r;
  QRect a1;
  QRect a2;
  undefined1 local_70 [16];
  undefined8 local_60;
  int local_58;
  int iStack_54;
  anon_union_24_3_e3d07ef4_for_data local_50;
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  
  QPainter::QPainter((QPainter *)local_70,(QPaintDevice *)&this->field_0x10);
  pPVar2 = (this->d).d;
  lVar3 = *(long *)&pPVar2->q->field_0x20;
  local_58 = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
  iStack_54 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  local_60 = 0;
  if (pPVar2->animate == false) {
    pPVar2->lastPaintedValue = pPVar2->value;
    dVar10 = (double)pPVar2->value / (double)(pPVar2->maximum - pPVar2->minimum);
    OVar1 = pPVar2->orientation;
    if (OVar1 == Horizontal) {
      uVar9 = (uint)(dVar10 * (double)(local_58 + 1));
      uVar7 = 0;
      local_50._0_4_ = local_58 - uVar9;
      if (pPVar2->invertedAppearance == false) {
        local_50._0_4_ = uVar7;
      }
      uVar5 = pPVar2->grooveHeight;
      local_50._4_4_ = 0;
    }
    else {
      uVar5 = (uint)(dVar10 * (double)(iStack_54 + 1));
      local_50._0_4_ = 0;
      uVar7 = (uint)(OVar1 == Vertical);
      local_50._4_4_ = 0;
      if (OVar1 == Vertical) {
        local_50._4_4_ = 0;
        if (pPVar2->invertedAppearance != false) {
          local_50._4_4_ = iStack_54 - uVar5;
        }
      }
      uVar9 = pPVar2->grooveHeight;
    }
    local_50._8_4_ = local_50._0_4_ + uVar9 + -1;
    local_50._12_4_ = local_50._4_4_ + uVar5 + -1;
    if (OVar1 == Horizontal) {
      uVar4 = 0;
      if (pPVar2->invertedAppearance == false) {
        uVar4 = uVar9;
      }
    }
    else {
      uVar4 = 0;
    }
    if ((char)uVar7 == '\0') {
      local_30 = 0;
    }
    else {
      local_30 = 0;
      if (pPVar2->invertedAppearance == false) {
        local_30 = (ulong)uVar5 << 0x20;
      }
    }
    iVar8 = 0;
    if (OVar1 == Horizontal) {
      iVar8 = 0;
      if (pPVar2->invertedAppearance != false) {
        iVar8 = -uVar9;
      }
    }
    iVar6 = 0;
    if ((char)uVar7 != '\0') {
      iVar6 = 0;
      if (pPVar2->invertedAppearance != false) {
        iVar6 = -uVar5;
      }
    }
    local_30 = local_30 | uVar4;
    local_28 = CONCAT44(iStack_54 + iVar6,local_58 + iVar8);
    QPainter::setPen((QColor *)local_70);
    QBrush::QBrush((QBrush *)(local_70 + 8),&((this->d).d)->grooveColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_70);
    QBrush::~QBrush((QBrush *)(local_70 + 8));
    QPainter::drawRects((QRect *)local_70,(int)&local_30);
    QPainter::setPen((QColor *)local_70);
    QBrush::QBrush((QBrush *)(local_70 + 8),&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_70);
    QBrush::~QBrush((QBrush *)(local_70 + 8));
    QPainter::drawRects((QRect *)local_70,(int)&local_50);
  }
  else {
    QVariantAnimation::currentValue();
    local_20 = (double)QVariant::toDouble((bool *)local_50.data);
    QVariant::~QVariant((QVariant *)&local_50);
    QPainter::setPen((QColor *)local_70);
    QBrush::QBrush((QBrush *)local_50.data,&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_70);
    QBrush::~QBrush((QBrush *)local_50.data);
    QPainter::drawRects((QRect *)local_70,(int)&local_60);
    pPVar2 = (this->d).d;
    if (pPVar2->orientation == Horizontal) {
      iVar8 = pPVar2->grooveHeight;
      dVar10 = (double)local_60._4_4_;
      local_50._0_4_ =
           (int)((double)iVar8 +
                ((double)(int)((local_58 - (uint)local_60) + 1) * local_20) / 3.0 +
                (double)(int)(uint)local_60);
    }
    else {
      iVar8 = pPVar2->grooveHeight;
      dVar10 = (double)iVar8 +
               ((double)((iStack_54 - local_60._4_4_) + 1) * local_20) / 3.0 +
               (double)local_60._4_4_;
      local_50._0_4_ = (uint)local_60;
    }
    local_50._4_4_ = (undefined4)dVar10;
    local_50._8_4_ = local_50._0_4_ + iVar8 + -1;
    local_50._12_4_ = iVar8 + local_50._4_4_ + -1;
    if (pPVar2->orientation == Horizontal) {
      iVar6 = (local_58 - (uint)local_60) + 1;
      dVar10 = (double)local_60._4_4_;
      uVar5 = (int)((double)(iVar6 / 3) +
                   (local_20 * (double)iVar6) / 1.5 + (double)(int)(uint)local_60);
    }
    else {
      iVar6 = (iStack_54 - local_60._4_4_) + 1;
      dVar10 = (double)(iVar6 / 3) + (local_20 * (double)iVar6) / 1.5 + (double)local_60._4_4_;
      uVar5 = (uint)local_60;
    }
    local_30 = CONCAT44((int)dVar10,uVar5);
    local_28 = CONCAT44(iVar8 + -1 + (int)dVar10,uVar5 + iVar8 + -1);
    QPainter::setPen((QColor *)local_70);
    QBrush::QBrush((QBrush *)(local_70 + 8),&((this->d).d)->animationColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_70);
    QBrush::~QBrush((QBrush *)(local_70 + 8));
    QPainter::drawRects((QRect *)local_70,(int)&local_50);
    QPainter::drawRects((QRect *)local_70,(int)&local_30);
  }
  QPainter::~QPainter((QPainter *)local_70);
  return;
}

Assistant:

void
ProgressBar::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	const QRect r = d->grooveRect();

	if( !d->animate )
	{
		d->lastPaintedValue = d->value;

		const int offset = (qreal) d->value / (qreal) ( d->maximum - d->minimum ) *
			( d->orientation == Qt::Horizontal ? r.width() : r.height() );

		const int x = ( ( d->orientation == Qt::Horizontal && d->invertedAppearance ) ?
			r.x() + r.width() - offset - 1 : 0 );
		const int y = ( ( d->orientation == Qt::Vertical && d->invertedAppearance ) ?
			r.y() + r.height() - offset - 1 : 0 );
		const int width = ( d->orientation == Qt::Horizontal ?
			offset : d->grooveHeight );
		const int height = ( d->orientation == Qt::Horizontal ?
			d->grooveHeight : offset );

		const QRect highlightedRect( x, y, width, height );
		const QRect baseRect = r.adjusted(
			( d->orientation == Qt::Horizontal && !d->invertedAppearance ?
				  width : 0 ),
			( d->orientation == Qt::Vertical && !d->invertedAppearance ?
				  height : 0 ),
			( d->orientation == Qt::Horizontal && d->invertedAppearance ?
				  -width : 0 ),
			( d->orientation == Qt::Vertical && d->invertedAppearance ?
				  -height : 0 ) );

		p.setPen( d->grooveColor );
		p.setBrush( d->grooveColor );

		p.drawRect( baseRect );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( highlightedRect );
	}
	else
	{
		const double value = d->animation->currentValue().toDouble();

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( r );

		const QRect a1(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 3.0 + d->grooveHeight :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 3.0 + d->grooveHeight ),
			d->grooveHeight, d->grooveHeight );

		const QRect a2(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 1.5 + r.width() / 3 :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 1.5 + r.height() / 3 ),
			d->grooveHeight, d->grooveHeight );

		p.setPen( d->animationColor );
		p.setBrush( d->animationColor );

		p.drawRect( a1 );
		p.drawRect( a2 );
	}
}